

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O3

time_t xstrpisotime(char *s,char **endptr)

{
  char cVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  time_t tVar11;
  char *local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  char *local_18;
  
  local_28 = (undefined1  [16])0x0;
  local_18 = (char *)0x0;
  for (; (cVar1 = *s, cVar1 == '\t' || (cVar1 == ' ')); s = s + 1) {
  }
  bVar6 = cVar1 - 0x30;
  iVar4 = 0;
  pcVar10 = s;
  if (bVar6 < 10) {
    iVar9 = 0;
    iVar7 = 0xfff;
    do {
      pcVar10 = pcVar10 + 1;
      iVar4 = (uint)bVar6 + iVar9;
      if ((0x199 < iVar4) || (0xffffffec < iVar7 - 10U)) break;
      iVar7 = iVar7 / 10;
      iVar9 = iVar4 * 10;
      bVar6 = *pcVar10 - 0x30;
    } while (bVar6 < 10);
  }
  iVar7 = -2;
  if (0xfffff62e < iVar4 - 0x1000U) {
    iVar7 = iVar4;
  }
  local_38._4_4_ = -1;
  if (s != pcVar10) {
    local_38._4_4_ = iVar7;
  }
  tVar11 = -1;
  local_50 = pcVar10;
  if (((-1 < (int)local_38._4_4_) && (local_50 = pcVar10 + 1, *pcVar10 == '-')) &&
     (bVar6 = *local_50 - 0x30, bVar6 < 10)) {
    iVar4 = 0;
    uVar5 = 0xc;
    pcVar10 = pcVar10 + 2;
    do {
      pcVar3 = pcVar10;
      local_38._0_4_ = (uint)bVar6 + iVar4;
      if ((1 < (int)local_38._0_4_) || (0xffffffec < uVar5 - 10)) break;
      uVar5 = uVar5 / 10;
      iVar4 = local_38._0_4_ * 10;
      bVar6 = *pcVar3 - 0x30;
      pcVar10 = pcVar3 + 1;
    } while (bVar6 < 10);
    local_50 = pcVar3;
    if (0xfffffff3 < local_38._0_4_ - 0xd) {
      local_38._8_8_ = 0;
      local_50 = pcVar3 + 1;
      if ((*pcVar3 == '-') && (bVar6 = *local_50 - 0x30, bVar6 < 10)) {
        iVar4 = 0;
        uVar5 = 0x1f;
        pcVar10 = pcVar3 + 2;
        do {
          pcVar3 = pcVar10;
          iVar7 = (uint)bVar6 + iVar4;
          if ((3 < iVar7) || (0xffffffec < uVar5 - 10)) break;
          uVar5 = uVar5 / 10;
          iVar4 = iVar7 * 10;
          bVar6 = *pcVar3 - 0x30;
          pcVar10 = pcVar3 + 1;
        } while (bVar6 < 10);
        local_50 = pcVar3;
        if (((0xffffffe0 < iVar7 - 0x20U) && (local_50 = pcVar3 + 1, *pcVar3 == 'T')) &&
           (bVar6 = *local_50 - 0x30, bVar6 < 10)) {
          iVar4 = 0;
          uVar5 = 0x17;
          pcVar10 = pcVar3 + 2;
          do {
            pcVar3 = pcVar10;
            uVar8 = (uint)bVar6 + iVar4;
            if ((2 < (int)uVar8) || (0xffffffec < uVar5 - 10)) break;
            uVar5 = uVar5 / 10;
            iVar4 = uVar8 * 10;
            bVar6 = *pcVar3 - 0x30;
            pcVar10 = pcVar3 + 1;
          } while (bVar6 < 10);
          local_50 = pcVar3;
          if (uVar8 < 0x18) {
            auVar2._4_4_ = iVar7;
            auVar2._0_4_ = uVar8;
            auVar2._8_8_ = 0;
            local_48 = auVar2 << 0x40;
            local_50 = pcVar3 + 1;
            if (*pcVar3 == ':') {
              iVar4 = strtoi_lim(local_50,&local_50,0,0x3b);
              local_48._4_4_ = iVar4;
              if ((-1 < iVar4) &&
                 (pcVar10 = local_50 + 1, cVar1 = *local_50, local_50 = pcVar10, cVar1 == ':')) {
                iVar4 = strtoi_lim(pcVar10,&local_50,0,0x3c);
                auVar2 = local_38;
                local_48._0_4_ = iVar4;
                if ((-1 < iVar4) &&
                   (pcVar10 = local_50 + 1, cVar1 = *local_50, local_50 = pcVar10, cVar1 == 'Z')) {
                  iVar4 = local_38._0_4_;
                  local_38._4_4_ = local_38._4_4_ + -0x76c;
                  local_38._0_4_ = iVar4 + -1;
                  local_38._8_8_ = auVar2._8_8_;
                  tVar11 = timegm((tm *)local_48);
                }
              }
            }
          }
        }
      }
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = local_50;
  }
  return tVar11;
}

Assistant:

static time_t
xstrpisotime(const char *s, char **endptr)
{
/** like strptime() but strictly for ISO 8601 Zulu strings */
	struct tm tm;
	time_t res = (time_t)-1;

	/* make sure tm is clean */
	memset(&tm, 0, sizeof(tm));

	/* as a courtesy to our callers, and since this is a non-standard
	 * routine, we skip leading whitespace */
	while (*s == ' ' || *s == '\t')
		++s;

	/* read year */
	if ((tm.tm_year = strtoi_lim(s, &s, 1583, 4095)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read month */
	if ((tm.tm_mon = strtoi_lim(s, &s, 1, 12)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read day-of-month */
	if ((tm.tm_mday = strtoi_lim(s, &s, 1, 31)) < 0 || *s++ != 'T') {
		goto out;
	}
	/* read hour */
	if ((tm.tm_hour = strtoi_lim(s, &s, 0, 23)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read minute */
	if ((tm.tm_min = strtoi_lim(s, &s, 0, 59)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read second */
	if ((tm.tm_sec = strtoi_lim(s, &s, 0, 60)) < 0 || *s++ != 'Z') {
		goto out;
	}

	/* massage TM to fulfill some of POSIX' constraints */
	tm.tm_year -= 1900;
	tm.tm_mon--;

	/* now convert our custom tm struct to a unix stamp using UTC */
	res = time_from_tm(&tm);

out:
	if (endptr != NULL) {
		*endptr = deconst(s);
	}
	return res;
}